

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityReader::tryRead
          (HttpFixedLengthEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  String *__return_storage_ptr___00;
  char (*params) [64];
  HttpInputStreamImpl *this_01;
  HttpEntityBodyReader *this_02;
  PromiseArenaMember *node;
  char *pcVar1;
  undefined8 uVar2;
  SourceLocation location;
  bool bVar3;
  int iVar4;
  coroutine_handle<void> coroutine;
  HttpInputStreamImpl *buffer_00;
  long lVar5;
  long in_R8;
  unsigned_long *in_R9;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Fault local_70;
  DebugExpression<bool_&> local_68;
  char *pcStack_60;
  undefined8 local_58;
  ExceptionOrValue *local_50;
  FixVoid<unsigned_long> *local_48;
  unsigned_long *local_40;
  Exception *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x468);
  *(code **)coroutine._M_fr_ptr = tryRead;
  *(code **)((long)coroutine._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  *(void **)((long)coroutine._M_fr_ptr + 0x438) = buffer;
  local_68.value = (bool *)0x50fbd6;
  pcStack_60 = "tryRead";
  local_58 = 0x13000007c5;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dfd0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062e018;
  local_50 = (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98);
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x7c5;
  location.columnNumber = 0x13;
  kj::_::CoroutineBase::CoroutineBase((CoroutineBase *)this_00,coroutine,local_50,location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0062dfd0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0062e018;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)this_00;
  local_68.value = (bool *)((long)buffer + 0x20);
  if (*(char *)((long)buffer + 0x20) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[59]>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x7c6,FAILED,"clean",
               "_kjCondition,\"can\'t read more data after a previous read didn\'t complete\"",
               &local_68,
               (char (*) [59])"can\'t read more data after a previous read didn\'t complete");
    kj::_::Debug::Fault::fatal(&local_70);
  }
  __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x240);
  __return_storage_ptr___00 = (String *)((long)coroutine._M_fr_ptr + 0x400);
  params = (char (*) [64])((long)coroutine._M_fr_ptr + 0x418);
  local_48 = (FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x420);
  local_40 = (unsigned_long *)((long)coroutine._M_fr_ptr + 0x428);
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x430);
  *local_68.value = false;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x428) = 0;
  local_38 = (Exception *)((long)coroutine._M_fr_ptr + 0x260);
  do {
    *(void **)((long)coroutine._M_fr_ptr + 0x458) = buffer;
    *(size_t *)((long)coroutine._M_fr_ptr + 0x450) = minBytes;
    *(size_t *)((long)coroutine._M_fr_ptr + 0x448) = maxBytes;
    *(long *)((long)coroutine._M_fr_ptr + 0x440) = in_R8;
    this_02 = *(HttpEntityBodyReader **)((long)coroutine._M_fr_ptr + 0x438);
    if (this_02[1].super_AsyncInputStream._vptr_AsyncInputStream == (_func_int **)0x0) {
      *(undefined1 *)&this_02[1].weakInner.ptr = 1;
      *local_48 = 0;
      kj::_::Coroutine<unsigned_long>::fulfill(this_00,local_48);
      goto LAB_003aadab;
    }
    buffer_00 = HttpEntityBodyReader::getInner(this_02);
    HttpInputStreamImpl::tryRead(this_01,buffer_00,minBytes,1);
    co_await<unsigned_long>(__return_storage_ptr__,(Promise<unsigned_long> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x460) = 0;
    bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar3) {
      return (PromiseBase)(PromiseBase)this;
    }
    buffer = (void *)kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
      Exception::~Exception(local_38);
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
    if (node != (PromiseArenaMember *)0x0) {
      (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    lVar5 = *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x438) + 0x18) - (long)buffer;
    *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x438) + 0x18) = lVar5;
    if (lVar5 == 0) {
      HttpEntityBodyReader::doneReading
                (*(HttpEntityBodyReader **)((long)coroutine._M_fr_ptr + 0x438));
LAB_003aad04:
      *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x438) + 0x20) = 1;
      *(long *)((long)coroutine._M_fr_ptr + 0x418) =
           *(long *)((long)coroutine._M_fr_ptr + 0x428) + (long)buffer;
      kj::_::Coroutine<unsigned_long>::fulfill(this_00,(FixVoid<unsigned_long> *)params);
      minBytes = *(size_t *)((long)coroutine._M_fr_ptr + 0x450);
      in_R8 = *(long *)((long)coroutine._M_fr_ptr + 0x440);
      maxBytes = *(size_t *)((long)coroutine._M_fr_ptr + 0x448);
      iVar4 = 3;
    }
    else {
      if (buffer == (void *)0x0) {
        *(unsigned_long *)*params = lVar5 + *local_40;
        kj::_::Debug::makeDescription<char_const(&)[64],unsigned_long&,unsigned_long&>
                  (__return_storage_ptr___00,
                   (Debug *)
                   "\"premature EOF in HTTP entity body; did not reach Content-Length\", expectedLength, alreadyRead"
                   ,"premature EOF in HTTP entity body; did not reach Content-Length",params,
                   local_40,in_R9);
        Exception::Exception
                  ((Exception *)__return_storage_ptr__,DISCONNECTED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x7df,__return_storage_ptr___00);
        throwRecoverableException((Exception *)__return_storage_ptr__,0);
        Exception::~Exception((Exception *)__return_storage_ptr__);
        pcVar1 = (__return_storage_ptr___00->content).ptr;
        if (pcVar1 != (char *)0x0) {
          uVar2 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x408);
          (__return_storage_ptr___00->content).ptr = (char *)0x0;
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x408) = 0;
          in_R9 = (unsigned_long *)0x0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x410))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x410),pcVar1,1,uVar2,uVar2);
        }
        goto LAB_003aad04;
      }
      maxBytes = (long)*(void **)((long)coroutine._M_fr_ptr + 0x448) - (long)buffer;
      if (*(void **)((long)coroutine._M_fr_ptr + 0x448) < buffer || maxBytes == 0)
      goto LAB_003aad04;
      minBytes = *(long *)((long)coroutine._M_fr_ptr + 0x450) + (long)buffer;
      in_R8 = *(long *)((long)coroutine._M_fr_ptr + 0x440) - (long)buffer;
      *(long *)((long)coroutine._M_fr_ptr + 0x428) =
           *(long *)((long)coroutine._M_fr_ptr + 0x428) + (long)buffer;
      iVar4 = 8;
    }
  } while (iVar4 == 8);
  if (iVar4 == 3) {
LAB_003aadab:
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x460) = 1;
  }
  else {
    if ((local_50->exception).ptr.isSet == true) {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
    }
    kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
    operator_delete(coroutine._M_fr_ptr,0x468);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(clean, "can't read more data after a previous read didn't complete");
    clean = false;

    size_t alreadyRead = 0;

    for (;;) {
      if (length == 0) {
        clean = true;
        co_return 0;
      }

      // We have to set minBytes to 1 here so that if we read any data at all, we update our
      // counter immediately, so that we still know where we are in case of cancellation.
      auto amount = co_await getInner().tryRead(buffer, 1, kj::min(maxBytes, length));

      length -= amount;
      if (length > 0) {
        // We haven't reached the end of the entity body yet.
        if (amount == 0) {
          size_t expectedLength = length + alreadyRead;
          kj::throwRecoverableException(KJ_EXCEPTION(
            DISCONNECTED,
            "premature EOF in HTTP entity body; did not reach Content-Length",
            expectedLength,
            alreadyRead
          ));
        } else if (amount < minBytes) {
          // We requested a minimum 1 byte above, but our own caller actually set a larger minimum
          // which has not yet been reached. Keep trying until we reach it.
          buffer = reinterpret_cast<byte*>(buffer) + amount;
          minBytes -= amount;
          maxBytes -= amount;
          alreadyRead += amount;
          continue;
        }
      } else if (length == 0) {
        doneReading();
      }
      clean = true;
      co_return amount + alreadyRead;
    }
  }